

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicNotify
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          AtomicNotify *curr)

{
  char *this_00;
  Address memorySize;
  Address addr;
  anon_union_16_5_9943fe1e_for_Literal_0 local_100;
  undefined8 local_f0;
  undefined1 local_e8 [8];
  Flow count;
  undefined1 local_88 [8];
  Flow ptr;
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_88,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ptr);
  if (ptr.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)local_e8,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->notifyCount)
    ;
    if (count.breakTo.super_IString.str._M_len == 0) {
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)&ptr.breakTo.super_IString.str._M_str,this,
                 (Name)(curr->memory).super_IString.str);
      memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)
                                 ptr.breakTo.super_IString.str._M_str,(Name)info._0_16_);
      this_00 = ptr.breakTo.super_IString.str._M_str;
      if (((long)((long)ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
          -0x5555555555555555 + (long)local_88 != 1) {
        __assert_fail("values.size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                      ,0x43,"const Literal &wasm::Flow::getSingleValue()");
      }
      ::wasm::Literal::Literal((Literal *)&count.breakTo.super_IString.str._M_str,(Literal *)&ptr);
      addr = getFinalAddress<wasm::AtomicNotify>
                       ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,curr,
                        (Literal *)&count.breakTo.super_IString.str._M_str,4,memorySize);
      ::wasm::Literal::~Literal((Literal *)&count.breakTo.super_IString.str._M_str);
      checkAtomicAddress((ModuleRunnerBase<wasm::ModuleRunner> *)
                         ptr.breakTo.super_IString.str._M_str,addr,4,memorySize);
      local_100.i32 = 0;
      local_f0 = 2;
      Flow::Flow(__return_storage_ptr__,(Literal *)&local_100.func);
      ::wasm::Literal::~Literal((Literal *)&local_100.func);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)local_e8;
      ::wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&count);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)count.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           count.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           count.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      count.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      count.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      count.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)count.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)count.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &count.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    ::wasm::Literal::~Literal((Literal *)&count);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_88;
    ::wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&ptr);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)ptr.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&ptr);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicNotify(AtomicNotify* curr) {
    NOTE_ENTER("AtomicNotify");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    NOTE_EVAL1(ptr);
    auto count = self()->visit(curr->notifyCount);
    NOTE_EVAL1(count);
    if (count.breaking()) {
      return count;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr =
      info.instance->getFinalAddress(curr, ptr.getSingleValue(), 4, memorySize);
    // Just check TODO actual threads support
    info.instance->checkAtomicAddress(addr, 4, memorySize);
    return Literal(int32_t(0)); // none woken up
  }